

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplaceRealloc<std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *this,pointer pos,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  size_t *psVar5;
  pointer pbVar6;
  basic_string_view<char,_std::char_traits<char>_> *__cur;
  size_t *psVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  ulong capacity;
  
  if (*(long *)(this + 8) == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar8 = (long)pos - *(long *)this;
  ctx = (EVP_PKEY_CTX *)0x10;
  psVar5 = (size_t *)detail::allocArray(capacity,0x10);
  pcVar4 = args->_M_str;
  *(size_t *)((long)psVar5 + lVar8) = args->_M_len;
  ((size_t *)((long)psVar5 + lVar8))[1] = (size_t)pcVar4;
  pbVar6 = *(pointer *)this;
  psVar7 = psVar5;
  if (pbVar6 + *(long *)(this + 8) == pos) {
    for (; pbVar6 != pos; pbVar6 = pbVar6 + 1) {
      pcVar4 = pbVar6->_M_str;
      *psVar7 = pbVar6->_M_len;
      psVar7[1] = (size_t)pcVar4;
      psVar7 = psVar7 + 2;
    }
  }
  else {
    for (; pbVar6 != pos; pbVar6 = pbVar6 + 1) {
      pcVar4 = pbVar6->_M_str;
      *psVar7 = pbVar6->_M_len;
      psVar7[1] = (size_t)pcVar4;
      psVar7 = psVar7 + 2;
    }
    lVar2 = *(long *)(this + 8);
    lVar3 = *(long *)this;
    psVar7 = (size_t *)((long)psVar5 + lVar8);
    for (; pos != (pointer)(lVar2 * 0x10 + lVar3); pos = pos + 1) {
      pcVar4 = pos->_M_str;
      psVar7[2] = pos->_M_len;
      psVar7[3] = (size_t)pcVar4;
      psVar7 = psVar7 + 2;
    }
  }
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
            ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = capacity;
  *(size_t **)this = psVar5;
  return (pointer)((long)psVar5 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}